

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O0

void __thiscall
helics::UnknownHandleManager::processNonOptionalUnknowns
          (UnknownHandleManager *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
          *cfunc)

{
  pair<helics::GlobalHandle,_unsigned_short> __args_2;
  pair<helics::GlobalHandle,_unsigned_short> __args_2_00;
  pair<helics::GlobalHandle,_unsigned_short> __args_2_01;
  pair<helics::GlobalHandle,_unsigned_short> __args_2_02;
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type *ufilt;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1_3;
  value_type *uinp;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1_2;
  value_type *uept;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1_1;
  value_type *upub;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  uint in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  GlobalFederateId in_stack_ffffffffffffff0c;
  undefined8 in_stack_ffffffffffffff10;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_e0;
  size_type *local_d8;
  GlobalHandle local_cc;
  undefined4 local_c4;
  GlobalHandle local_bc;
  undefined4 local_b4;
  reference local_b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  GlobalHandle local_8c;
  undefined4 local_84;
  GlobalHandle local_7c;
  undefined4 local_74;
  reference local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_60;
  undefined1 *local_58;
  GlobalHandle local_4c;
  undefined4 local_44;
  GlobalHandle local_3c;
  undefined4 local_34;
  reference local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  local_20 [4];
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::begin((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::end((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = std::__detail::operator==(local_20,&local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_30 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                            *)0x5b2143);
    in_stack_fffffffffffffee4 = (uint)(local_30->second).second;
    uVar2 = make_flags(8);
    if ((in_stack_fffffffffffffee4 & uVar2) == 0) {
      local_4c = (local_30->second).first;
      local_44 = *(undefined4 *)&(local_30->second).second;
      __args_2.first.handle.hid = (int)in_stack_ffffffffffffff10;
      __args_2.second = (short)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      __args_2._10_2_ = (short)((ulong)in_stack_ffffffffffffff10 >> 0x30);
      __args_2.first.fed_id.gid = in_stack_ffffffffffffff0c.gid;
      local_3c = local_4c;
      local_34 = local_44;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                    *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_RDI,
                   (InterfaceType)(in_stack_fffffffffffffee4 >> 0x18),__args_2);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  local_58 = (undefined1 *)((long)&in_RDI[1].field_2 + 8);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::begin((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::end((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = std::__detail::operator==(&local_60,&local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_70 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                            *)0x5b2259);
    in_stack_fffffffffffffee0 = (uint)(local_70->second).second;
    uVar2 = make_flags(8);
    if ((in_stack_fffffffffffffee0 & uVar2) == 0) {
      local_8c = (local_70->second).first;
      local_84 = *(undefined4 *)&(local_70->second).second;
      __args_2_00.first.handle.hid = (int)in_stack_ffffffffffffff10;
      __args_2_00.second = (short)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      __args_2_00._10_2_ = (short)((ulong)in_stack_ffffffffffffff10 >> 0x30);
      __args_2_00.first.fed_id.gid = in_stack_ffffffffffffff0c.gid;
      local_7c = local_8c;
      local_74 = local_84;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                    *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_RDI,
                   (InterfaceType)(in_stack_fffffffffffffee4 >> 0x18),__args_2_00);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  local_98 = &in_RDI[3].field_2;
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::begin((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::end((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = std::__detail::operator==(&local_a0,&local_a8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_b0 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                            *)0x5b236f);
    in_stack_fffffffffffffedc = (uint)(local_b0->second).second;
    uVar2 = make_flags(8);
    if ((in_stack_fffffffffffffedc & uVar2) == 0) {
      local_cc = (local_b0->second).first;
      local_c4 = *(undefined4 *)&(local_b0->second).second;
      __args_2_01.first.handle.hid = (int)in_stack_ffffffffffffff10;
      __args_2_01.second = (short)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      __args_2_01._10_2_ = (short)((ulong)in_stack_ffffffffffffff10 >> 0x30);
      __args_2_01.first.fed_id.gid = in_stack_ffffffffffffff0c.gid;
      local_bc = local_cc;
      local_b4 = local_c4;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                    *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_RDI,
                   (InterfaceType)(in_stack_fffffffffffffee4 >> 0x18),__args_2_01);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  local_d8 = &in_RDI[5]._M_string_length;
  local_e0._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::begin((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_e8._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
       ::end((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = std::__detail::operator==(&local_e0,&local_e8), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                          *)0x5b244b);
    uVar3 = (uint)(pvVar4->second).second;
    uVar2 = make_flags(8);
    if ((uVar3 & uVar2) == 0) {
      __args_2_02._4_8_ = pvVar4;
      __args_2_02.first.fed_id.gid = *(BaseType *)&(pvVar4->second).second;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                    *)CONCAT44((pvVar4->second).first.fed_id.gid,in_stack_fffffffffffffef0),in_RDI,
                   (InterfaceType)(in_stack_fffffffffffffee4 >> 0x18),__args_2_02);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>
                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  return;
}

Assistant:

void UnknownHandleManager::processNonOptionalUnknowns(
    const std::function<void(const std::string&, InterfaceType, TargetInfo handle)>& cfunc) const
{
    for (const auto& upub : unknown_publications) {
        if ((upub.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(upub.first, InterfaceType::PUBLICATION, upub.second);
    }
    for (const auto& uept : unknown_endpoints) {
        if ((uept.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(uept.first, InterfaceType::ENDPOINT, uept.second);
    }
    for (const auto& uinp : unknown_inputs) {
        if ((uinp.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(uinp.first, InterfaceType::INPUT, uinp.second);
    }

    for (const auto& ufilt : unknown_filters) {
        if ((ufilt.second.second & make_flags(optional_flag)) != 0) {
            continue;
        }
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second);
    }
}